

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefile.cxx
# Opt level: O0

bool __thiscall
cmMakefile::ValidateCustomCommand(cmMakefile *this,cmCustomCommandLines *commandLines)

{
  bool bVar1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this_00;
  ulong uVar2;
  const_reference pvVar3;
  char *pcVar4;
  ostream *poVar5;
  string local_1e8;
  ostringstream local_1b8 [8];
  ostringstream e;
  cmCustomCommandLine *cl;
  const_iterator __end1;
  const_iterator __begin1;
  cmCustomCommandLines *__range1;
  cmCustomCommandLines *commandLines_local;
  cmMakefile *this_local;
  
  __end1 = std::vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>::begin
                     (&commandLines->
                       super_vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>);
  cl = (cmCustomCommandLine *)
       std::vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>::end
                 (&commandLines->
                   super_vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>);
  do {
    bVar1 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<const_cmCustomCommandLine_*,_std::vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>_>
                                *)&cl);
    if (!bVar1) {
      return true;
    }
    this_00 = &__gnu_cxx::
               __normal_iterator<const_cmCustomCommandLine_*,_std::vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>_>
               ::operator*(&__end1)->
               super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ;
    bVar1 = std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::empty(this_00);
    if (!bVar1) {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::operator[](this_00,0);
      uVar2 = std::__cxx11::string::empty();
      if ((uVar2 & 1) == 0) {
        pvVar3 = std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::operator[](this_00,0);
        pcVar4 = (char *)std::__cxx11::string::operator[]((ulong)pvVar3);
        if (*pcVar4 == '\"') {
          std::__cxx11::ostringstream::ostringstream(local_1b8);
          poVar5 = std::operator<<((ostream *)local_1b8,
                                   "COMMAND may not contain literal quotes:\n  ");
          pvVar3 = std::
                   vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ::operator[](this_00,0);
          poVar5 = std::operator<<(poVar5,(string *)pvVar3);
          std::operator<<(poVar5,"\n");
          std::__cxx11::ostringstream::str();
          IssueMessage(this,FATAL_ERROR,&local_1e8);
          std::__cxx11::string::~string((string *)&local_1e8);
          std::__cxx11::ostringstream::~ostringstream(local_1b8);
          return false;
        }
      }
    }
    __gnu_cxx::
    __normal_iterator<const_cmCustomCommandLine_*,_std::vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>_>
    ::operator++(&__end1);
  } while( true );
}

Assistant:

bool cmMakefile::ValidateCustomCommand(
  const cmCustomCommandLines& commandLines) const
{
  // TODO: More strict?
  for (cmCustomCommandLine const& cl : commandLines) {
    if (!cl.empty() && !cl[0].empty() && cl[0][0] == '"') {
      std::ostringstream e;
      e << "COMMAND may not contain literal quotes:\n  " << cl[0] << "\n";
      this->IssueMessage(MessageType::FATAL_ERROR, e.str());
      return false;
    }
  }

  return true;
}